

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

idx_t duckdb::UpdateStringStatistics
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  bool bVar4;
  idx_t i;
  idx_t iVar5;
  idx_t iVar6;
  idx_t row_idx;
  anon_struct_16_3_d7536bce_for_pointer aVar7;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      psVar3 = update->sel->sel_vector;
      iVar5 = iVar6;
      if (psVar3 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar3[iVar6];
      }
      paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar2 + iVar5 * 0x10);
      StringStats::Update(&stats->statistics,(string_t *)&paVar1->pointer);
      if (0xc < *(uint *)(pdVar2 + iVar5 * 0x10)) {
        aVar7 = (anon_struct_16_3_d7536bce_for_pointer)
                StringHeap::AddBlob(&segment->heap,(string_t *)&paVar1->pointer);
        paVar1->pointer = aVar7;
      }
    }
    ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
               &sel->selection_data);
    sel->sel_vector = (sel_t *)0x0;
    iVar6 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    iVar6 = 0;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      psVar3 = update->sel->sel_vector;
      row_idx = iVar5;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[iVar5];
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(update->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar4) {
        sel->sel_vector[iVar6] = (sel_t)iVar5;
        iVar6 = iVar6 + 1;
        paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar2 + row_idx * 0x10);
        StringStats::Update(&stats->statistics,(string_t *)&paVar1->pointer);
        if (0xc < *(uint *)(pdVar2 + row_idx * 0x10)) {
          aVar7 = (anon_struct_16_3_d7536bce_for_pointer)
                  StringHeap::AddBlob(&segment->heap,(string_t *)&paVar1->pointer);
          paVar1->pointer = aVar7;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

idx_t UpdateStringStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update, idx_t count,
                             SelectionVector &sel) {
	auto update_data = update.GetDataNoConst<string_t>(update);
	auto &mask = update.validity;
	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			auto &str = update_data[idx];
			StringStats::Update(stats.statistics, str);
			if (!str.IsInlined()) {
				update_data[idx] = segment->GetStringHeap().AddBlob(str);
			}
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				auto &str = update_data[idx];
				StringStats::Update(stats.statistics, str);
				if (!str.IsInlined()) {
					update_data[idx] = segment->GetStringHeap().AddBlob(str);
				}
			}
		}
		return not_null_count;
	}
}